

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sumsurface.cpp
# Opt level: O1

bool __thiscall
ON_SumSurface::GetBBox(ON_SumSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  ON_BoundingBox *this_00;
  double dVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  ON_SumSurface *pS;
  ON_BoundingBox bboxA;
  ON_BoundingBox bboxB;
  ON_BoundingBox local_e8;
  ON_SumSurface *local_b8;
  ON_3dPoint local_b0;
  ON_BoundingBox local_98;
  ON_BoundingBox local_60;
  
  this_00 = &this->m_bbox;
  bVar2 = ON_BoundingBox::IsValid(this_00);
  if (!bVar2) {
    ON_BoundingBox::ON_BoundingBox(&local_e8);
    ON_BoundingBox::ON_BoundingBox(&local_98);
    if (this->m_curve[0] != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_60,&this->m_curve[0]->super_ON_Geometry);
      local_e8.m_max.y = local_60.m_max.y;
      local_e8.m_max.z = local_60.m_max.z;
      local_e8.m_min.z = local_60.m_min.z;
      local_e8.m_max.x = local_60.m_max.x;
      local_e8.m_min.x = local_60.m_min.x;
      local_e8.m_min.y = local_60.m_min.y;
    }
    if (this->m_curve[1] != (ON_Curve *)0x0) {
      ON_Geometry::BoundingBox(&local_60,&this->m_curve[1]->super_ON_Geometry);
      local_98.m_max.y = local_60.m_max.y;
      local_98.m_max.z = local_60.m_max.z;
      local_98.m_min.z = local_60.m_min.z;
      local_98.m_max.x = local_60.m_max.x;
      local_98.m_min.x = local_60.m_min.x;
      local_98.m_min.y = local_60.m_min.y;
    }
    bVar2 = ON_BoundingBox::IsValid(&local_e8);
    if ((bVar2) && (bVar2 = ON_BoundingBox::IsValid(&local_98), bVar2)) {
      ON_3dPoint::operator+(&local_b0,&local_e8.m_min,&local_98.m_min);
      ON_3dPoint::operator+(&local_60.m_min,&local_b0,&this->m_basepoint);
      (this->m_bbox).m_min.z = local_60.m_min.z;
      (this_00->m_min).x = local_60.m_min.x;
      (this->m_bbox).m_min.y = local_60.m_min.y;
      ON_3dPoint::operator+(&local_b0,&local_e8.m_max,&local_98.m_max);
      ON_3dPoint::operator+(&local_60.m_min,&local_b0,&this->m_basepoint);
      (this->m_bbox).m_max.z = local_60.m_min.z;
      (this->m_bbox).m_max.x = local_60.m_min.x;
      (this->m_bbox).m_max.y = local_60.m_min.y;
    }
    bVar2 = ON_BoundingBox::IsValid(this_00);
  }
  if (bVar2 != false) {
    iVar4 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                      (this);
    ON_BoundingBox::ON_BoundingBox(&local_e8);
    if (boxmax == (double *)0x0 || (!bGrowBox || boxmin == (double *)0x0)) {
      local_e8.m_min.x = (this_00->m_min).x;
      local_e8.m_min.y = (this->m_bbox).m_min.y;
      local_e8.m_min.z = (this->m_bbox).m_min.z;
      local_e8.m_max.x = (this->m_bbox).m_max.x;
      local_e8.m_max.y = (this->m_bbox).m_max.y;
      local_e8.m_max.z = (this->m_bbox).m_max.z;
    }
    else {
      local_b8 = this;
      if (0 < iVar4) {
        uVar5 = 2;
        if (iVar4 - 1U < 2) {
          uVar5 = iVar4 - 1U;
        }
        uVar7 = 0;
        do {
          dVar1 = boxmin[uVar7];
          pdVar6 = ON_3dPoint::operator[](&local_e8.m_min,(int)uVar7);
          *pdVar6 = dVar1;
          dVar1 = boxmax[uVar7];
          pdVar6 = ON_3dPoint::operator[](&local_e8.m_max,(int)uVar7);
          *pdVar6 = dVar1;
          uVar7 = uVar7 + 1;
        } while (uVar5 + 1 != uVar7);
      }
      bVar3 = ON_BoundingBox::IsValid(&local_e8);
      if (bVar3) {
        ON_BoundingBox::Union(&local_e8,this_00);
        this = local_b8;
      }
      else {
        local_e8.m_min.x = (this_00->m_min).x;
        local_e8.m_min.y = (this->m_bbox).m_min.y;
        local_e8.m_min.z = (this->m_bbox).m_min.z;
        local_e8.m_max.x = (this->m_bbox).m_max.x;
        local_e8.m_max.y = (this->m_bbox).m_max.y;
        local_e8.m_max.z = (this->m_bbox).m_max.z;
        this = local_b8;
      }
    }
    uVar5 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                      (this);
    if (0 < (int)uVar5) {
      uVar8 = 2;
      if (uVar5 - 1 < 2) {
        uVar8 = uVar5 - 1;
      }
      uVar7 = 0;
      do {
        if (boxmin != (double *)0x0) {
          pdVar6 = ON_3dPoint::operator[](&local_e8.m_min,(int)uVar7);
          boxmin[uVar7] = *pdVar6;
        }
        if (boxmax != (double *)0x0) {
          pdVar6 = ON_3dPoint::operator[](&local_e8.m_max,(int)uVar7);
          boxmax[uVar7] = *pdVar6;
        }
        uVar7 = uVar7 + 1;
      } while (uVar8 + 1 != uVar7);
    }
    if (3 < (int)uVar5) {
      uVar7 = 3;
      do {
        if (boxmin != (double *)0x0) {
          boxmin[uVar7] = 0.0;
        }
        if (boxmax != (double *)0x0) {
          boxmax[uVar7] = 0.0;
        }
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
    }
  }
  return bVar2;
}

Assistant:

bool ON_SumSurface::GetBBox( // returns true if successful
       double* boxmin,    // boxmin[dim]
       double* boxmax,    // boxmax[dim]
       bool bGrowBox
       ) const
{
  bool rc = m_bbox.IsValid();
  if (!rc )
  {
    // lazy bounding box evaluation
    ON_BoundingBox bboxA, bboxB;
    if ( m_curve[0] )
      bboxA = m_curve[0]->BoundingBox();
    if ( m_curve[1] )
      bboxB = m_curve[1]->BoundingBox();
    if ( bboxA.IsValid() && bboxB.IsValid() )
    {
      ON_SumSurface* pS = const_cast<ON_SumSurface*>(this);
      pS->m_bbox.m_min = bboxA.m_min + bboxB.m_min + m_basepoint;
      pS->m_bbox.m_max = bboxA.m_max + bboxB.m_max + m_basepoint;
    }
    rc = m_bbox.IsValid();
  }

  if ( rc )
  {
    int dim = Dimension();
    int j;
    ON_BoundingBox bbox;
    if ( bGrowBox && boxmin && boxmax )
    {
      for ( j = 0; j < 3 && j < dim; j++ )
      {
        bbox.m_min[j] = boxmin[j];
        bbox.m_max[j] = boxmax[j];
      }
      if ( !bbox.IsValid() )
        bbox = m_bbox;
      else
        bbox.Union(m_bbox);
    }
    else
      bbox = m_bbox;
    dim = Dimension();
    for ( j = 0; j < 3 && j < dim; j++ )
    {
      if(boxmin) 
        boxmin[j] = bbox.m_min[j];
      if(boxmax) 
        boxmax[j] = bbox.m_max[j];
    }
    for ( j = 3; j < dim; j++ )
    {
      if (boxmin) 
        boxmin[j] = 0.0;
      if (boxmax) 
        boxmax[j] = 0.0;
    }
  }
  return rc;
}